

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxgx_compress.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *path;
  bool bVar1;
  int iVar2;
  string_view local_60;
  undefined1 local_50 [8];
  string compressed;
  string raw;
  
  if (argc == 3) {
    path = argv[2];
    compressed.field_2._8_8_ = &raw._M_string_length;
    raw._M_dataplus._M_p = (pointer)0x0;
    raw._M_string_length._0_1_ = 0;
    bVar1 = mg::fs::read_file(argv[1],(string *)((long)&compressed.field_2 + 8));
    if (bVar1) {
      local_50 = (undefined1  [8])&compressed._M_string_length;
      compressed._M_dataplus._M_p = (pointer)0x0;
      compressed._M_string_length._0_1_ = 0;
      local_60._M_len = (size_t)raw._M_dataplus._M_p;
      local_60._M_str = (char *)compressed.field_2._8_8_;
      bVar1 = mg::data::nxgx_compress(&local_60,(string *)local_50);
      if (bVar1) {
        bVar1 = mg::fs::write_file(path,(string *)local_50);
        iVar2 = bVar1 - 1;
      }
      else {
        fwrite("Failed to compress\n",0x13,1,_stderr);
        iVar2 = -1;
      }
      std::__cxx11::string::~string((string *)local_50);
    }
    else {
      iVar2 = -1;
    }
    std::__cxx11::string::~string((string *)(compressed.field_2._M_local_buf + 8));
  }
  else {
    fprintf(_stderr,"%s input output\n",*argv);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int main(int argc, char **argv) {
  if (argc != 3) {
    fprintf(stderr, "%s input output\n", argv[0]);
    return -1;
  }

  // Name args
  const char *input_file = argv[1];
  const char *output_file = argv[2];

  // Read raw input data
  std::string raw;
  if (!mg::fs::read_file(input_file, raw)) {
    return -1;
  }

  // Compress
  std::string compressed;
  if (!mg::data::nxgx_compress(raw, compressed)) {
    fprintf(stderr, "Failed to compress\n");
    return -1;
  }

  // Write
  if (!mg::fs::write_file(output_file, compressed)) {
    return -1;
  }

  return 0;
}